

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

Expression *
slang::ast::TaggedUnionExpression::fromSyntax
          (Compilation *compilation,TaggedUnionExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  ExpressionSyntax *pEVar1;
  SyntaxNode *this;
  bool bVar2;
  Scope *this_00;
  Symbol *args_1;
  Type *this_01;
  SourceLocation location;
  TaggedUnionExpression *expr;
  Diagnostic *pDVar3;
  Expression *pEVar4;
  string_view name;
  SourceRange SVar5;
  Expression *valueExpr;
  Expression *local_48;
  Token local_40;
  
  if (assignmentTarget != (Type *)0x0) {
    bVar2 = Type::isTaggedUnion(assignmentTarget);
    if (bVar2) {
      name = parsing::Token::valueText(&syntax->member);
      if (assignmentTarget->canonical == (Type *)0x0) {
        Type::resolveCanonical(assignmentTarget);
      }
      this_00 = Symbol::as<slang::ast::Scope>(&assignmentTarget->canonical->super_Symbol);
      args_1 = Scope::find(this_00,name);
      if (args_1 == (Symbol *)0x0) {
        if (name._M_len != 0) {
          SVar5 = parsing::Token::range(&syntax->member);
          pDVar3 = ASTContext::addDiag(context,(DiagCode)0x33000a,SVar5);
          pDVar3 = Diagnostic::operator<<(pDVar3,name);
          ast::operator<<(pDVar3,assignmentTarget);
        }
        goto LAB_003a4967;
      }
      if (args_1->kind != Field) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                   ,0xc4,"decltype(auto) slang::ast::Symbol::as() [T = slang::ast::FieldSymbol]");
      }
      local_48 = (Expression *)0x0;
      pEVar1 = syntax->expr;
      this_01 = DeclaredType::getType((DeclaredType *)(args_1 + 1));
      if (pEVar1 == (ExpressionSyntax *)0x0) {
        if (this_01->canonical == (Type *)0x0) {
          Type::resolveCanonical(this_01);
        }
        if ((this_01->canonical->super_Symbol).kind != VoidType) {
          SVar5 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          pDVar3 = ASTContext::addDiag(context,(DiagCode)0x870007,SVar5);
          Diagnostic::operator<<(pDVar3,args_1->name);
          expr = (TaggedUnionExpression *)0x0;
          goto LAB_003a4a46;
        }
      }
      else {
        this = &syntax->expr->super_SyntaxNode;
        local_40 = slang::syntax::SyntaxNode::getFirstToken(this);
        location = parsing::Token::location(&local_40);
        local_48 = Expression::bindRValue
                             (this_01,(ExpressionSyntax *)this,location,context,
                              (bitmask<slang::ast::ASTFlags>)0x0);
      }
      local_40 = (Token)slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      expr = BumpAllocator::
             emplace<slang::ast::TaggedUnionExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::Expression_const*&,slang::SourceRange>
                       (&compilation->super_BumpAllocator,assignmentTarget,args_1,&local_48,
                        (SourceRange *)&local_40);
      if (local_48 == (Expression *)0x0) {
        return &expr->super_Expression;
      }
      bVar2 = Expression::bad(local_48);
      if (!bVar2) {
        return &expr->super_Expression;
      }
LAB_003a4a46:
      pEVar4 = Expression::badExpr(compilation,&expr->super_Expression);
      return pEVar4;
    }
    if (assignmentTarget->canonical == (Type *)0x0) {
      Type::resolveCanonical(assignmentTarget);
    }
    if ((assignmentTarget->canonical->super_Symbol).kind == ErrorType) goto LAB_003a4967;
  }
  SVar5 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  ASTContext::addDiag(context,(DiagCode)0x880007,SVar5);
LAB_003a4967:
  pEVar4 = Expression::badExpr(compilation,(Expression *)0x0);
  return pEVar4;
}

Assistant:

Expression& TaggedUnionExpression::fromSyntax(Compilation& compilation,
                                              const TaggedUnionExpressionSyntax& syntax,
                                              const ASTContext& context,
                                              const Type* assignmentTarget) {
    if (!assignmentTarget || !assignmentTarget->isTaggedUnion()) {
        if (!assignmentTarget || !assignmentTarget->isError())
            context.addDiag(diag::TaggedUnionTarget, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    auto memberName = syntax.member.valueText();
    auto member = assignmentTarget->getCanonicalType().as<Scope>().find(memberName);
    if (!member) {
        if (!memberName.empty()) {
            auto& diag = context.addDiag(diag::UnknownMember, syntax.member.range());
            diag << memberName << *assignmentTarget;
        }
        return badExpr(compilation, nullptr);
    }

    auto& field = member->as<FieldSymbol>();

    const Expression* valueExpr = nullptr;
    if (syntax.expr) {
        valueExpr = &bindRValue(field.getType(), *syntax.expr,
                                syntax.expr->getFirstToken().location(), context);
    }
    else if (!field.getType().isVoid()) {
        context.addDiag(diag::TaggedUnionMissingInit, syntax.sourceRange()) << field.name;
        return badExpr(compilation, nullptr);
    }

    auto result = compilation.emplace<TaggedUnionExpression>(*assignmentTarget, *member, valueExpr,
                                                             syntax.sourceRange());
    if (valueExpr && valueExpr->bad())
        return badExpr(compilation, result);

    return *result;
}